

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O2

void cppcms::impl::file_server::normalize_path(string *path)

{
  char *pcVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char *pcVar4;
  ptrdiff_t _Num;
  size_t __n;
  size_type sVar5;
  char *__dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar5 = path->_M_string_length;
  if ((sVar5 == 0) || (pcVar2 = (path->_M_dataplus)._M_p, *pcVar2 != '/')) {
    std::operator+(&local_50,"/",path);
    std::__cxx11::string::operator=((string *)path,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar2 = (path->_M_dataplus)._M_p;
    sVar5 = path->_M_string_length;
  }
  pcVar4 = pcVar2 + 1;
  __dest = pcVar4;
  do {
    if (pcVar2 + sVar5 <= pcVar4) break;
    local_50._M_dataplus._M_p._0_1_ = 0x2f;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar4,pcVar2 + sVar5,&local_50);
    __n = (long)_Var3._M_current - (long)pcVar4;
    if (__n != 0) {
      if (__n == 2) {
        if ((*pcVar4 != '.') || (pcVar4[1] != '.')) goto LAB_0021af6b;
        pcVar4 = (path->_M_dataplus)._M_p + 1;
        pcVar2 = __dest + -(ulong)(pcVar4 < __dest);
        do {
          __dest = pcVar2;
          if (pcVar2 <= pcVar4) break;
          __dest = pcVar2 + -1;
          pcVar1 = pcVar2 + -1;
          pcVar2 = __dest;
        } while (*pcVar1 != '/');
      }
      else if ((__n != 1) || (*pcVar4 != '.')) {
LAB_0021af6b:
        memmove(__dest,pcVar4,__n);
        __dest = __dest + __n;
        if (_Var3._M_current != (path->_M_dataplus)._M_p + path->_M_string_length) {
          *__dest = '/';
          __dest = __dest + 1;
        }
      }
    }
    pcVar2 = (path->_M_dataplus)._M_p;
    sVar5 = path->_M_string_length;
    pcVar4 = _Var3._M_current + 1;
  } while (_Var3._M_current != pcVar2 + sVar5);
  std::__cxx11::string::resize((ulong)path);
  return;
}

Assistant:

void file_server::normalize_path(std::string &path)
{
#ifdef CPPCMS_WIN32
	for(size_t i=0;i<path.size();i++)
		if(path[i]=='\\')
			path[i]='/';
#endif
	if(path.empty() || path[0]!='/')
		path = "/" + path;
	
	std::string::iterator out = path.begin() + 1;
	std::string::iterator start = path.begin() + 1;
	while(start < path.end()) {
		std::string::iterator end = std::find(start,path.end(),'/');
		if(end==start || (end-start == 1 && *start == '.')) { // case of "//" and "/./"
			// nothing to do
		}
		else if(end-start == 2 && *start == '.' && *(start+1) == '.') {
			std::string::iterator min_pos = path.begin() + 1;
			if(out > min_pos)
				out --;
			while(out > min_pos) {
				out --;
				if(*out == '/')
					break;
			}
		}
		else {
			out = std::copy(start,end,out);
			if(end != path.end())
				*out++ = '/';
		}
		if(end == path.end())
			break;
		start = end;
		++start;
	}
	if(*(out-1) == '/' && out > path.begin()+1)
		out--;
	path.resize(out - path.begin());
}